

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

void __thiscall cmFileCopier::MatchRule::MatchRule(MatchRule *this,string *regex)

{
  char *exp;
  pointer pcVar1;
  
  exp = (regex->_M_dataplus)._M_p;
  (this->Regex).program = (char *)0x0;
  if (exp != (char *)0x0) {
    cmsys::RegularExpression::compile(&this->Regex,exp);
  }
  (this->Properties).Exclude = false;
  (this->Properties).Permissions = 0;
  (this->RegexString)._M_dataplus._M_p = (pointer)&(this->RegexString).field_2;
  pcVar1 = (regex->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->RegexString,pcVar1,pcVar1 + regex->_M_string_length);
  return;
}

Assistant:

MatchRule(std::string const& regex):
      Regex(regex.c_str()), RegexString(regex) {}